

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autocorrelation_to_composite_sinusoidal_modeling.cc
# Opt level: O0

void __thiscall
sptk::AutocorrelationToCompositeSinusoidalModeling::AutocorrelationToCompositeSinusoidalModeling
          (AutocorrelationToCompositeSinusoidalModeling *this,int num_order,int num_iteration,
          double convergence_threshold)

{
  bool bVar1;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  double unaff_retaddr;
  int in_stack_00000008;
  int in_stack_0000000c;
  DurandKernerMethod *in_stack_00000010;
  
  *in_RDI = &PTR__AutocorrelationToCompositeSinusoidalModeling_0012dc68;
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  *(int *)((long)in_RDI + 0xc) =
       (*(int *)(in_RDI + 1) + 1) - (*(int *)(in_RDI + 1) + 1 >> 0x1f) >> 1;
  SymmetricSystemSolver::SymmetricSystemSolver
            ((SymmetricSystemSolver *)(in_RDI + 2),*(int *)((long)in_RDI + 0xc) + -1);
  DurandKernerMethod::DurandKernerMethod
            (in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr);
  VandermondeSystemSolver::VandermondeSystemSolver
            ((VandermondeSystemSolver *)(in_RDI + 0xe),*(int *)((long)in_RDI + 0xc) + -1);
  *(undefined1 *)(in_RDI + 0x10) = 1;
  if ((((*(int *)(in_RDI + 1) < 0) || (*(int *)(in_RDI + 1) % 2 == 0)) ||
      (bVar1 = SymmetricSystemSolver::IsValid((SymmetricSystemSolver *)(in_RDI + 2)), !bVar1)) ||
     ((bVar1 = DurandKernerMethod::IsValid((DurandKernerMethod *)(in_RDI + 4)), !bVar1 ||
      (bVar1 = VandermondeSystemSolver::IsValid((VandermondeSystemSolver *)(in_RDI + 0xe)), !bVar1))
     )) {
    *(undefined1 *)(in_RDI + 0x10) = 0;
  }
  return;
}

Assistant:

AutocorrelationToCompositeSinusoidalModeling::
    AutocorrelationToCompositeSinusoidalModeling(int num_order,
                                                 int num_iteration,
                                                 double convergence_threshold)
    : num_order_(num_order),
      num_sine_wave_((num_order_ + 1) / 2),
      symmetric_system_solver_(num_sine_wave_ - 1),
      durand_kerner_method_(num_sine_wave_, num_iteration,
                            convergence_threshold),
      vandermonde_system_solver_(num_sine_wave_ - 1),
      is_valid_(true) {
  if (num_order_ < 0 || 0 == num_order_ % 2 ||
      !symmetric_system_solver_.IsValid() || !durand_kerner_method_.IsValid() ||
      !vandermonde_system_solver_.IsValid()) {
    is_valid_ = false;
    return;
  }
}